

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

void free_nodes(min_heap *to_expand)

{
  bool bVar1;
  const_reference ppnVar2;
  node *old_node;
  min_heap *to_expand_local;
  
  while( true ) {
    bVar1 = std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::
            empty(to_expand);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppnVar2 = std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::
              top(to_expand);
    if (*ppnVar2 != (value_type)0x0) {
      operator_delete(*ppnVar2);
    }
    std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::pop
              (to_expand);
  }
  return;
}

Assistant:

void free_nodes(min_heap& to_expand){
    while(!to_expand.empty()){
        node* old_node = to_expand.top();
        delete old_node;
        to_expand.pop();
    }
}